

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

bool __thiscall Fossilize::VulkanDevice::init_device(VulkanDevice *this,Options *opts)

{
  VkInstance *ppVVar1;
  VkPhysicalDevice pVVar2;
  VkPhysicalDeviceFeatures2 *__src;
  VkApplicationInfo *app_info;
  pointer ppcVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  pointer ppcVar6;
  bool bVar7;
  bool bVar8;
  VkResult VVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  VkBaseInStructure *sin;
  VkPhysicalDevice *ppVVar14;
  int *piVar15;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_> _Var16
  ;
  pointer pVVar17;
  VkExtensionProperties *ext_1;
  ulong uVar18;
  VkLayerProperties *pVVar19;
  pointer pVVar20;
  uint uVar21;
  VkQueueFamilyProperties *pVVar22;
  VkExtensionProperties *ext;
  Options *pOVar23;
  VkPhysicalDeviceFeatures2 *target_features;
  uint32_t i;
  uint uVar24;
  uint32_t gpu_count;
  uint32_t device_layer_count;
  uint32_t device_ext_count;
  uint32_t ext_count;
  vector<const_char_*,_std::allocator<const_char_*>_> active_device_extensions;
  vector<const_char_*,_std::allocator<const_char_*>_> active_exts;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> exts;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> device_layers;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> device_ext_props;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> gpus;
  vector<const_char_*,_std::allocator<const_char_*>_> active_device_layers;
  vector<const_char_*,_std::allocator<const_char_*>_> active_layers;
  uint32_t validation_ext_count;
  uint32_t family_count;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> validation_extensions;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_props;
  size_t active_extension_count;
  VkPhysicalDeviceFeatures2 replacement_pdf2;
  VkPhysicalDeviceFeatures2 gpu_features2;
  VkPhysicalDeviceProperties2 gpu_props2;
  VkApplicationInfo app;
  uint32_t local_7e0;
  uint32_t local_7dc;
  uint32_t local_7d8;
  uint32_t local_7d4;
  Options *local_7d0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_7c8;
  char **local_7a8;
  iterator iStack_7a0;
  char **local_798;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_790;
  undefined1 local_778 [16];
  pointer local_768;
  VkDeviceQueueCreateInfo *pVStack_760;
  ulong local_758;
  pointer pVStack_750;
  ulong local_748;
  pointer local_740;
  pointer local_738;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_728;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> local_710;
  vector<const_char_*,_std::allocator<const_char_*>_> local_6f8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_6d8;
  char *local_6b8;
  uint32_t local_6b0;
  uint32_t local_6ac;
  VkInstanceCreateInfo local_6a8;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_660;
  VkDeviceQueueCreateInfo local_648;
  undefined8 local_618;
  void *pvStack_610;
  undefined8 local_608;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_5f8;
  size_type local_5e0;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined4 local_5c8;
  undefined4 uStack_5c4;
  undefined8 uStack_5c0;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 local_5b0;
  undefined4 uStack_5ac;
  VkBool32 local_5a8;
  VkBool32 VStack_5a4;
  undefined8 uStack_5a0;
  VkPhysicalDeviceFeatures2 local_598;
  undefined1 local_4a8 [16];
  undefined1 local_498 [224];
  undefined1 local_3b8 [16];
  pointer local_3a8;
  code *local_3a0;
  VulkanDevice *local_398;
  VkApplicationInfo local_68;
  
  if (opts->null_device == true) {
    init_null_device(this);
    return true;
  }
  VVar9 = volkInitialize();
  if (VVar9 != VK_SUCCESS) {
    init_device();
    return false;
  }
  uVar10 = volkGetInstanceVersion();
  uVar21 = uVar10 & 0xfffff000;
  if (uVar21 == 0) {
    init_device();
    return false;
  }
  uVar24 = uVar21;
  if ((opts->application_info != (VkApplicationInfo *)0x0) &&
     (uVar24 = opts->application_info->apiVersion & 0xfffff000, uVar21 < uVar24)) {
    init_device();
    return false;
  }
  local_7d4 = 0;
  VVar9 = (*vkEnumerateInstanceExtensionProperties)
                    ((char *)0x0,&local_7d4,(VkExtensionProperties *)0x0);
  if (VVar9 != VK_SUCCESS) {
    return false;
  }
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            (&local_790,(ulong)local_7d4,(allocator_type *)local_3b8);
  if (local_7d4 != 0) {
    bVar7 = false;
    VVar9 = (*vkEnumerateInstanceExtensionProperties)
                      ((char *)0x0,&local_7d4,
                       local_790.
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (VVar9 != VK_SUCCESS) goto LAB_0017169e;
  }
  local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7d0 = opts;
  if (opts->enable_validation == true) {
    local_598.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    VVar9 = (*vkEnumerateInstanceLayerProperties)(&local_598.sType,(VkLayerProperties *)0x0);
    if (VVar9 == VK_SUCCESS) {
      std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
                ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)local_3b8,
                 (ulong)local_598.sType,(allocator_type *)local_4a8);
      VVar9 = (*vkEnumerateInstanceLayerProperties)
                        (&local_598.sType,(VkLayerProperties *)local_3b8._0_8_);
      if (VVar9 == VK_SUCCESS) {
        bVar7 = find_layer((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                           local_3b8._0_8_,(char *)local_3b8._8_8_);
        if (bVar7) {
          local_4a8._0_8_ = "VK_LAYER_KHRONOS_validation";
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (&local_6d8,(value_type *)local_4a8);
          if ((VkLayerProperties *)local_3b8._0_8_ != (VkLayerProperties *)0x0) {
            operator_delete((void *)local_3b8._0_8_,(long)local_3a8 - local_3b8._0_8_);
          }
          goto LAB_001712a9;
        }
        init_device();
      }
      if ((VkLayerProperties *)local_3b8._0_8_ != (VkLayerProperties *)0x0) {
        operator_delete((void *)local_3b8._0_8_,(long)local_3a8 - local_3b8._0_8_);
      }
    }
    bVar7 = false;
  }
  else {
LAB_001712a9:
    ppcVar4 = local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppcVar3 = local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pOVar23 = local_7d0;
    bVar7 = find_extension((Fossilize *)
                           local_790.
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           local_790.
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_finish,"VK_EXT_debug_report");
    local_6a8.pNext = (void *)0x0;
    local_6a8.enabledExtensionCount = 0;
    local_6a8._52_4_ = 0;
    local_6a8.ppEnabledExtensionNames = (char **)0x0;
    local_6a8.flags = 0;
    local_6a8._20_4_ = 0;
    local_6a8.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    local_6a8._4_4_ = 0;
    local_68.applicationVersion = 0;
    local_68._28_4_ = 0;
    local_68.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    local_68._4_4_ = 0;
    local_68.pNext = (void *)0x0;
    local_68._40_8_ = ((ulong)uVar10 & 0xfffff000) << 0x20;
    local_68.pApplicationName = "Fossilize Replayer";
    local_68.pEngineName = "Fossilize";
    uVar18 = (long)ppcVar4 - (long)ppcVar3;
    local_6a8.ppEnabledLayerNames = (char **)0x0;
    if (uVar18 != 0) {
      local_6a8.ppEnabledLayerNames = ppcVar3;
    }
    uVar18 = uVar18 >> 3;
    local_6a8._32_8_ = uVar18 & 0xffffffff;
    local_6a8.pApplicationInfo = pOVar23->application_info;
    if (pOVar23->application_info == (VkApplicationInfo *)0x0) {
      local_6a8.pApplicationInfo = &local_68;
    }
    if ((int)uVar18 != 0) {
      uVar18 = 0;
      do {
        fprintf(_stderr,"Fossilize INFO: Enabling instance layer: %s\n",
                local_6a8.ppEnabledLayerNames[uVar18]);
        fflush(_stderr);
        uVar18 = uVar18 + 1;
      } while (uVar18 < (local_6a8._32_8_ & 0xffffffff));
      if (local_6a8.enabledExtensionCount != 0) {
        init_device();
      }
    }
    pVVar20 = local_790.
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_7a8 = (char **)0x0;
    iStack_7a0._M_current = (char **)0x0;
    local_798 = (char **)0x0;
    if (local_790.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_790.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pVVar19 = (VkLayerProperties *)
                local_790.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if ((0x400fff < (local_6a8.pApplicationInfo)->apiVersion) ||
           (iVar11 = strcmp("VK_KHR_surface_protected_capabilities",pVVar19->layerName), iVar11 != 0
           )) {
          local_3b8._0_8_ = pVVar19;
          if (iStack_7a0._M_current == local_798) {
            std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                      ((vector<char_const*,std::allocator<char_const*>> *)&local_7a8,iStack_7a0,
                       (char **)local_3b8);
          }
          else {
            *iStack_7a0._M_current = pVVar19->layerName;
            iStack_7a0._M_current = iStack_7a0._M_current + 1;
          }
        }
        pVVar19 = (VkLayerProperties *)&pVVar19->implementationVersion;
      } while (pVVar19 != (VkLayerProperties *)pVVar20);
    }
    local_6a8.ppEnabledExtensionNames = local_7a8;
    if ((long)iStack_7a0._M_current - (long)local_7a8 == 0) {
      local_6a8.ppEnabledExtensionNames = (char **)0x0;
    }
    local_6a8.enabledExtensionCount =
         (uint32_t)((ulong)((long)iStack_7a0._M_current - (long)local_7a8) >> 3);
    ppVVar1 = &this->instance;
    VVar9 = (*vkCreateInstance)(&local_6a8,(VkAllocationCallbacks *)0x0,ppVVar1);
    if (VVar9 == VK_SUCCESS) {
      volkLoadInstance(*ppVVar1);
      if (bVar7) {
        local_3b8._8_8_ = (pointer)0x0;
        local_3b8._0_8_ = (VkLayerProperties *)0x3b9af4f8;
        local_3a0 = debug_callback;
        local_3a8 = (pointer)0x8;
        bVar7 = false;
        local_398 = this;
        VVar9 = (*vkCreateDebugReportCallbackEXT)
                          (this->instance,(VkDebugReportCallbackCreateInfoEXT *)local_3b8,
                           (VkAllocationCallbacks *)0x0,&this->callback);
        if (VVar9 != VK_SUCCESS) goto LAB_0017166a;
      }
      local_7e0 = 0;
      bVar7 = false;
      VVar9 = (*vkEnumeratePhysicalDevices)(*ppVVar1,&local_7e0,(VkPhysicalDevice *)0x0);
      if (VVar9 == VK_SUCCESS) {
        std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
                  (&local_710,(ulong)local_7e0,(allocator_type *)local_3b8);
        if (local_7e0 == 0) {
          init_device();
LAB_00171563:
          bVar7 = false;
        }
        else {
          VVar9 = (*vkEnumeratePhysicalDevices)
                            (*ppVVar1,&local_7e0,
                             local_710.
                             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if (VVar9 != VK_SUCCESS) goto LAB_00171563;
          if (local_7e0 != 0) {
            init_device();
          }
          pOVar23 = local_7d0;
          uVar18 = (ulong)local_7d0->device_index;
          ppVVar14 = local_710.
                     super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (-1 < (long)uVar18) {
            if ((ulong)((long)local_710.
                              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_710.
                              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar18) {
              init_device();
              goto LAB_00171563;
            }
            ppVVar14 = local_710.
                       super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar18;
          }
          pVVar2 = *ppVVar14;
          this->gpu = pVVar2;
          (*vkGetPhysicalDeviceProperties)(pVVar2,&this->gpu_props);
          fwrite("Fossilize INFO: Chose GPU:\n",0x1b,1,_stderr);
          fflush(_stderr);
          fprintf(_stderr,"Fossilize INFO:   name: %s\n",(this->gpu_props).deviceName);
          fflush(_stderr);
          uVar12 = (this->gpu_props).apiVersion;
          fprintf(_stderr,"Fossilize INFO:   apiVersion: %u.%u.%u\n",(ulong)(uVar12 >> 0x16),
                  (ulong)(uVar12 >> 0xc & 0x3ff),(ulong)(uVar12 & 0xfff));
          fflush(_stderr);
          fprintf(_stderr,"Fossilize INFO:   vendorID: 0x%x\n",(ulong)(this->gpu_props).vendorID);
          fflush(_stderr);
          fprintf(_stderr,"Fossilize INFO:   deviceID: 0x%x\n",(ulong)(this->gpu_props).deviceID);
          fflush(_stderr);
          uVar12 = (this->gpu_props).apiVersion & 0xfffff000;
          if (uVar12 <= uVar21) {
            uVar21 = uVar12;
          }
          if (pOVar23->application_info == (VkApplicationInfo *)0x0) {
            uVar24 = uVar21;
          }
          if (uVar12 < uVar24) {
            init_device();
            goto LAB_00171563;
          }
          this->api_version = uVar24;
          local_7c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_7c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (char **)0x0;
          local_7c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_7d8 = 0;
          bVar7 = false;
          VVar9 = (*vkEnumerateDeviceExtensionProperties)
                            (this->gpu,(char *)0x0,&local_7d8,(VkExtensionProperties *)0x0);
          if (VVar9 == VK_SUCCESS) {
            std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
                      (&local_728,(ulong)local_7d8,(allocator_type *)local_3b8);
            if (local_7d8 == 0) {
LAB_001718cb:
              pVVar20 = local_728.
                        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (local_728.
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_728.
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pVVar19 = (VkLayerProperties *)
                          local_728.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  bVar7 = filter_extension((Fossilize *)pVVar19,
                                           (char *)(ulong)local_7d0->want_amd_shader_info,
                                           SUB81(local_728.
                                                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                                 ._M_impl.super__Vector_impl_data._M_start,0),
                                           (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                            *)local_728.
                                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,
                                           this->api_version);
                  if (bVar7) {
                    local_3b8._0_8_ = pVVar19;
                    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                              (&local_7c8,(value_type *)local_3b8);
                  }
                  pVVar19 = (VkLayerProperties *)&pVVar19->implementationVersion;
                } while (pVVar19 != (VkLayerProperties *)pVVar20);
              }
              bVar7 = find_extension((Fossilize *)
                                     local_790.
                                     super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                      *)local_790.
                                        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                     "VK_KHR_get_physical_device_properties2");
              memset(local_4a8,0,0xf0);
              local_4a8._0_4_ = 0x3b9bb078;
              local_4a8._8_8_ = &local_618;
              local_608 = 0;
              local_618 = 0x3b9ee4c8;
              pvStack_610 = (void *)0x0;
              if (bVar7) {
                pvStack_610 = build_pnext_chain(&this->features,this->api_version,
                                                local_7c8.
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (uint32_t)
                                                ((ulong)((long)local_7c8.
                                                                                                                              
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_7c8.
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                (*vkGetPhysicalDeviceFeatures2KHR)(this->gpu,(VkPhysicalDeviceFeatures2 *)local_4a8)
                ;
                pOVar23 = local_7d0;
                this->pipeline_stats = (int)local_608 != 0;
                if (((int)local_608 == 0) || (uVar13 = 1, local_7d0->want_pipeline_stats == false))
                {
                  uVar13 = 0;
                }
                local_608 = CONCAT44(local_608._4_4_,uVar13);
                memset((VkPhysicalDeviceProperties2 *)local_3b8,0,0x348);
                local_3b8._0_4_ = 0x3b9bb079;
                local_3b8._8_8_ =
                     build_pnext_chain(&this->props,this->api_version,
                                       local_7c8.
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       (uint32_t)
                                       ((ulong)((long)local_7c8.
                                                                                                            
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_7c8.
                                                                                                          
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                (*vkGetPhysicalDeviceProperties2KHR)
                          (this->gpu,(VkPhysicalDeviceProperties2 *)local_3b8);
              }
              else {
                (*vkGetPhysicalDeviceFeatures)(this->gpu,(VkPhysicalDeviceFeatures *)local_498);
                memset(local_3b8,0,0x348);
                local_3b8._0_4_ = 0x3b9bb079;
                (*vkGetPhysicalDeviceProperties)(this->gpu,(VkPhysicalDeviceProperties *)&local_3a8)
                ;
                pOVar23 = local_7d0;
              }
              __src = pOVar23->features;
              if (__src == (VkPhysicalDeviceFeatures2 *)0x0) {
                target_features = (VkPhysicalDeviceFeatures2 *)0x0;
              }
              else {
                app_info = pOVar23->application_info;
                bVar8 = application_info_promote_robustness2(app_info);
                target_features = __src;
                if (bVar8) {
                  for (piVar15 = (int *)__src->pNext; piVar15 != (int *)0x0;
                      piVar15 = *(int **)(piVar15 + 2)) {
                    if (*piVar15 == 0x3b9f2730) goto LAB_00171b84;
                  }
                  VStack_5a4 = 0;
                  uStack_5a0 = 0;
                  uStack_5b4 = 0;
                  local_5b0 = 0;
                  uStack_5ac = 0;
                  local_5a8 = 0;
                  local_5b8 = 0x3b9f2730;
                  if (&local_598 != __src) {
                    memcpy(&local_598,__src,0xf0);
                    target_features = &local_598;
                  }
                  local_5b0 = SUB84(local_598.pNext,0);
                  uStack_5ac = (undefined4)((ulong)local_598.pNext >> 0x20);
                  local_5a8 = (__src->features).robustBufferAccess;
                  uStack_5a0 = CONCAT44(uStack_5a0._4_4_,1);
                  VStack_5a4 = local_5a8;
                  local_598.pNext = &local_5b8;
                }
LAB_00171b84:
                if (((app_info != (VkApplicationInfo *)0x0) &&
                    (app_info->pEngineName != (char *)0x0)) &&
                   (iVar11 = strcmp("vkd3d",app_info->pEngineName), iVar11 == 0)) {
                  for (piVar15 = (int *)__src->pNext; piVar15 != (int *)0x0;
                      piVar15 = *(int **)(piVar15 + 2)) {
                    if (*piVar15 == 0x3b9e3cd3) goto LAB_00171c34;
                  }
                  uStack_5c4 = 0;
                  uStack_5c0 = 0;
                  uStack_5d4 = 0;
                  local_5d0 = 0;
                  uStack_5cc = 0;
                  local_5c8 = 0;
                  local_5d8 = 0x3b9e3cd3;
                  if (&local_598 != target_features) {
                    memcpy(&local_598,target_features,0xf0);
                    target_features = &local_598;
                  }
                  local_5d0 = SUB84(local_598.pNext,0);
                  uStack_5cc = (undefined4)((ulong)local_598.pNext >> 0x20);
                  local_5c8 = 1;
                  uStack_5c4 = 1;
                  uStack_5c0 = CONCAT44(uStack_5c0._4_4_,1);
                  local_598.pNext = &local_5d8;
                }
              }
LAB_00171c34:
              local_5e0 = (long)local_7c8.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_7c8.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3;
              filter_feature_enablement
                        ((VkPhysicalDeviceFeatures2 *)local_4a8,&this->features,target_features,
                         local_7c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_5e0);
              std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&local_7c8,local_5e0)
              ;
              local_6ac = 0;
              (*vkGetPhysicalDeviceQueueFamilyProperties)
                        (this->gpu,&local_6ac,(VkQueueFamilyProperties *)0x0);
              std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::vector
                        (&local_5f8,(ulong)local_6ac,(allocator_type *)local_778);
              (*vkGetPhysicalDeviceQueueFamilyProperties)
                        (this->gpu,&local_6ac,
                         local_5f8.
                         super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              local_648.pNext = (void *)0x0;
              local_648.flags = 0;
              local_648.queueFamilyIndex = 0;
              local_648.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
              local_648._4_4_ = 0;
              local_648.pQueuePriorities = &init_device::one;
              local_648.queueCount = 1;
              local_648._28_4_ = 0;
              if (local_5f8.
                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_5f8.
                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar18 = 0;
                do {
                  if ((*(int *)((long)&(local_5f8.
                                        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->queueCount +
                               uVar18) != 0) &&
                     ((*(byte *)((long)&(local_5f8.
                                         super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->queueFlags +
                                uVar18) & 1) != 0)) {
                    local_648._16_8_ = (ulong)(uint)((int)(uVar18 >> 3) * -0x55555555) << 0x20;
                    break;
                  }
                  pVVar22 = (VkQueueFamilyProperties *)
                            ((long)&local_5f8.
                                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].queueFlags + uVar18
                            );
                  uVar18 = uVar18 + 0x18;
                } while (pVVar22 !=
                         local_5f8.
                         super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (local_7d0->enable_validation == true) {
                local_7dc = 0;
                VVar9 = (*vkEnumerateDeviceLayerProperties)
                                  (this->gpu,&local_7dc,(VkLayerProperties *)0x0);
                if (VVar9 == VK_SUCCESS) {
                  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
                            ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                             local_778,(ulong)local_7dc,(allocator_type *)&local_660);
                  if ((local_7dc == 0) ||
                     (VVar9 = (*vkEnumerateDeviceLayerProperties)
                                        (this->gpu,&local_7dc,(VkLayerProperties *)local_778._0_8_),
                     VVar9 == VK_SUCCESS)) {
                    bVar8 = find_layer((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                        *)local_778._0_8_,(char *)local_778._8_8_);
                    if (bVar8) {
                      local_660.
                      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ac5a5;
                      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                (&local_6f8,(value_type *)&local_660);
                      local_6b0 = 0;
                      (*vkEnumerateDeviceExtensionProperties)
                                (this->gpu,"VK_LAYER_KHRONOS_validation",&local_6b0,
                                 (VkExtensionProperties *)0x0);
                      std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
                      vector(&local_660,(ulong)local_6b0,(allocator_type *)&local_6b8);
                      (*vkEnumerateDeviceExtensionProperties)
                                (this->gpu,"VK_LAYER_KHRONOS_validation",&local_6b0,
                                 local_660.
                                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      pVVar20 = local_660.
                                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      bVar8 = find_extension((Fossilize *)
                                             local_660.
                                             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                             (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                              *)local_660.
                                                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                                ._M_impl.super__Vector_impl_data._M_finish,
                                             "VK_EXT_validation_cache");
                      this->validation_cache = bVar8;
                      if (bVar8) {
                        local_6b8 = "VK_EXT_validation_cache";
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                  (&local_7c8,&local_6b8);
                        pVVar20 = local_660.
                                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      }
                      if (pVVar20 != (VkExtensionProperties *)0x0) {
                        operator_delete(pVVar20,(long)local_660.
                                                                                                            
                                                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)pVVar20);
                      }
                      if ((VkLayerProperties *)local_778._0_8_ != (VkLayerProperties *)0x0) {
                        operator_delete((void *)local_778._0_8_,(long)local_768 - local_778._0_8_);
                      }
                      goto LAB_00171d93;
                    }
                    init_device();
                  }
                  if ((VkLayerProperties *)local_778._0_8_ != (VkLayerProperties *)0x0) {
                    operator_delete((void *)local_778._0_8_,(long)local_768 - local_778._0_8_);
                  }
                }
LAB_00171d86:
                bVar7 = false;
              }
              else {
LAB_00171d93:
                ppcVar6 = local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                ppcVar5 = local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                ppcVar4 = local_7c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                ppcVar3 = local_7c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                _Var16 = std::
                         find_if<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
                                   (local_7c8.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    local_7c8.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish);
                this->supports_pipeline_feedback = _Var16._M_current != ppcVar4;
                _Var16 = std::
                         find_if<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                   (ppcVar3,ppcVar4);
                this->amd_shader_info = _Var16._M_current != ppcVar4;
                this->supports_module_identifiers =
                     (this->features).shader_module_identifier.shaderModuleIdentifier == 1;
                local_778._0_8_ = (VkLayerProperties *)0x3;
                pVVar17 = (pointer)0x0;
                local_778._8_8_ = (pointer)local_4a8;
                if (!bVar7) {
                  local_778._8_8_ = pVVar17;
                }
                local_738 = (pointer)local_498;
                if (bVar7) {
                  local_738 = pVVar17;
                }
                pVStack_760 = &local_648;
                local_768 = (pointer)0x100000000;
                uVar18 = (long)ppcVar6 - (long)ppcVar5;
                pVStack_750 = (pointer)ppcVar5;
                if (uVar18 == 0) {
                  pVStack_750 = pVVar17;
                }
                uVar18 = uVar18 >> 3;
                local_758 = uVar18 & 0xffffffff;
                local_740 = (pointer)ppcVar3;
                if ((long)ppcVar4 - (long)ppcVar3 == 0) {
                  local_740 = pVVar17;
                }
                local_748 = (ulong)((long)ppcVar4 - (long)ppcVar3) >> 3;
                uVar10 = (uint32_t)local_748;
                local_748 = local_748 & 0xffffffff;
                if ((pVStack_750 != (pointer)0x0) && ((int)uVar18 != 0)) {
                  uVar18 = 0;
                  do {
                    fprintf(_stderr,"Fossilize INFO: Enabling device layer: %s\n",
                            *(undefined8 *)((long)pVStack_750->layerName + uVar18 * 2 * 4));
                    fflush(_stderr);
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < (local_758 & 0xffffffff));
                  uVar10 = (uint32_t)local_748;
                }
                if ((local_740 != (pointer)0x0) && (uVar10 != 0)) {
                  init_device();
                }
                VVar9 = (*vkCreateDevice)(this->gpu,(VkDeviceCreateInfo *)local_778,
                                          (VkAllocationCallbacks *)0x0,&this->device);
                if (VVar9 != VK_SUCCESS) {
                  init_device();
                  goto LAB_00171d86;
                }
                iVar11 = FeatureFilter::init(&this->feature_filter,
                                             (EVP_PKEY_CTX *)(ulong)this->api_version);
                if ((char)iVar11 == '\0') {
                  init_device();
                  goto LAB_00171d86;
                }
                FeatureFilter::set_device_query_interface
                          (&this->feature_filter,&this->super_DeviceQueryInterface);
                bVar7 = true;
              }
              if ((pointer)local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                           ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_6f8.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_6f8.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_6f8.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_5f8.
                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start != (VkQueueFamilyProperties *)0x0) {
                operator_delete(local_5f8.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_5f8.
                                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_5f8.
                                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              bVar7 = false;
              VVar9 = (*vkEnumerateDeviceExtensionProperties)
                                (this->gpu,(char *)0x0,&local_7d8,
                                 local_728.
                                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              if (VVar9 == VK_SUCCESS) goto LAB_001718cb;
            }
            if ((VkLayerProperties *)
                local_728.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_start != (VkLayerProperties *)0x0) {
              operator_delete(local_728.
                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_728.
                                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_728.
                                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((pointer)local_7c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_7c8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_7c8.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_7c8.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_710.
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_start != (VkPhysicalDevice *)0x0) {
          operator_delete(local_710.
                          super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_710.
                                super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_710.
                                super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    else {
      init_device();
      bVar7 = false;
    }
LAB_0017166a:
    if (local_7a8 != (char **)0x0) {
      operator_delete(local_7a8,(long)local_798 - (long)local_7a8);
    }
  }
  if (local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0017169e:
  if ((VkLayerProperties *)
      local_790.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (VkLayerProperties *)0x0) {
    operator_delete(local_790.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_790.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_790.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool VulkanDevice::init_device(const Options &opts)
{
	if (opts.null_device)
	{
		init_null_device();
		return true;
	}

	if (volkInitialize() != VK_SUCCESS)
	{
		LOGE("volkInitialize failed.\n");
		return false;
	}

	uint32_t instance_api_version = major_minor_version(volkGetInstanceVersion());
	if (instance_api_version == 0)
	{
		LOGE("Could not find loader.\n");
		return false;
	}

	uint32_t target_api_version = opts.application_info ? opts.application_info->apiVersion : instance_api_version;
	target_api_version = major_minor_version(target_api_version);

	if (target_api_version > instance_api_version)
	{
		LOGE("Database is targeting an API version which is unsupported by this Vulkan loader.\n");
		return false;
	}

	// Enable all extensions (FIXME: this is likely a problem).
	uint32_t ext_count = 0;
	if (vkEnumerateInstanceExtensionProperties(nullptr, &ext_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkExtensionProperties> exts(ext_count);
	if (ext_count && vkEnumerateInstanceExtensionProperties(nullptr, &ext_count, exts.data()) != VK_SUCCESS)
		return false;

	vector<const char *> active_layers;
	if (opts.enable_validation)
	{
		uint32_t layer_count = 0;
		if (vkEnumerateInstanceLayerProperties(&layer_count, nullptr) != VK_SUCCESS)
			return false;
		vector<VkLayerProperties> layers(layer_count);
		if (vkEnumerateInstanceLayerProperties(&layer_count, layers.data()) != VK_SUCCESS)
			return false;

		if (find_layer(layers, "VK_LAYER_KHRONOS_validation"))
			active_layers.push_back("VK_LAYER_KHRONOS_validation");
		else
		{
			LOGE("Cannot find VK_LAYER_KHRONOS_validation layer.\n");
			return false;
		}
	}

	bool use_debug_callback = find_extension(exts, VK_EXT_DEBUG_REPORT_EXTENSION_NAME);

	VkInstanceCreateInfo instance_info = { VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO };
	VkApplicationInfo app = { VK_STRUCTURE_TYPE_APPLICATION_INFO };
	app.apiVersion = instance_api_version;
	app.pApplicationName = "Fossilize Replayer";
	app.pEngineName = "Fossilize";

	instance_info.enabledLayerCount = uint32_t(active_layers.size());
	instance_info.ppEnabledLayerNames = active_layers.empty() ? nullptr : active_layers.data();
	instance_info.pApplicationInfo = opts.application_info ? opts.application_info : &app;

	for (uint32_t i = 0; i < instance_info.enabledLayerCount; i++)
		LOGI("Enabling instance layer: %s\n", instance_info.ppEnabledLayerNames[i]);
	for (uint32_t i = 0; i < instance_info.enabledExtensionCount; i++)
		LOGI("Enabling instance extension: %s\n", instance_info.ppEnabledExtensionNames[i]);

	vector<const char *> active_exts;
	for (auto &ext : exts)
		if (filter_instance_extension(ext.extensionName, instance_info.pApplicationInfo->apiVersion))
			active_exts.push_back(ext.extensionName);

	instance_info.enabledExtensionCount = uint32_t(active_exts.size());
	instance_info.ppEnabledExtensionNames = active_exts.empty() ? nullptr : active_exts.data();

	if (vkCreateInstance(&instance_info, nullptr, &instance) != VK_SUCCESS)
	{
		LOGE("Failed to create instance.\n");
		return false;
	}

	volkLoadInstance(instance);

	if (use_debug_callback)
	{
		VkDebugReportCallbackCreateInfoEXT cb_info = { VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT };
		cb_info.pfnCallback = debug_callback;
		cb_info.flags = VK_DEBUG_REPORT_ERROR_BIT_EXT;
		cb_info.pUserData = this;

		if (vkCreateDebugReportCallbackEXT(instance, &cb_info, nullptr, &callback) != VK_SUCCESS)
			return false;
	}

	uint32_t gpu_count = 0;
	if (vkEnumeratePhysicalDevices(instance, &gpu_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkPhysicalDevice> gpus(gpu_count);

	if (!gpu_count)
	{
		LOGE("No physical devices.\n");
		return false;
	}

	if (vkEnumeratePhysicalDevices(instance, &gpu_count, gpus.data()) != VK_SUCCESS)
		return false;

	for (uint32_t i = 0; i < gpu_count; i++)
	{
		vkGetPhysicalDeviceProperties(gpus[i], &gpu_props);
		LOGI("Enumerated GPU #%u:\n", i);
		LOGI("  name: %s\n", gpu_props.deviceName);
		LOGI("  apiVersion: %u.%u.%u\n",
		     VK_VERSION_MAJOR(gpu_props.apiVersion),
		     VK_VERSION_MINOR(gpu_props.apiVersion),
		     VK_VERSION_PATCH(gpu_props.apiVersion));
	}

	if (opts.device_index >= 0)
	{
		if (size_t(opts.device_index) >= gpus.size())
		{
			LOGE("Device index %d is out of range, only %u devices on system.\n",
			     opts.device_index, unsigned(gpus.size()));
			return false;
		}
		gpu = gpus[opts.device_index];
	}
	else
		gpu = gpus.front();

	vkGetPhysicalDeviceProperties(gpu, &gpu_props);
	LOGI("Chose GPU:\n");
	LOGI("  name: %s\n", gpu_props.deviceName);
	LOGI("  apiVersion: %u.%u.%u\n",
	     VK_VERSION_MAJOR(gpu_props.apiVersion),
	     VK_VERSION_MINOR(gpu_props.apiVersion),
	     VK_VERSION_PATCH(gpu_props.apiVersion));
	LOGI("  vendorID: 0x%x\n", gpu_props.vendorID);
	LOGI("  deviceID: 0x%x\n", gpu_props.deviceID);

	uint32_t gpu_api_version = major_minor_version(gpu_props.apiVersion);
	if (!opts.application_info)
		target_api_version = instance_api_version < gpu_api_version ? instance_api_version : gpu_api_version;

	if (target_api_version > gpu_api_version)
	{
		LOGE("Selected GPU does not support desired Vulkan API version.\n");
		return false;
	}

	api_version = target_api_version;

	vector<const char *> active_device_extensions;
	uint32_t device_ext_count = 0;
	if (vkEnumerateDeviceExtensionProperties(gpu, nullptr, &device_ext_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkExtensionProperties> device_ext_props(device_ext_count);
	if (device_ext_count && vkEnumerateDeviceExtensionProperties(gpu, nullptr, &device_ext_count, device_ext_props.data()) != VK_SUCCESS)
		return false;

	for (auto &ext : device_ext_props)
		if (filter_extension(ext.extensionName, opts.want_amd_shader_info, device_ext_props, api_version))
			active_device_extensions.push_back(ext.extensionName);

	bool has_device_features2 = find_extension(exts, VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);

	VkPhysicalDeviceFeatures2 gpu_features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
	VkPhysicalDevicePipelineExecutablePropertiesFeaturesKHR stats_feature = {
		VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_EXECUTABLE_PROPERTIES_FEATURES_KHR
	};
	gpu_features2.pNext = &stats_feature;
	if (has_device_features2)
	{
		stats_feature.pNext = build_pnext_chain(features, api_version,
		                                        active_device_extensions.data(),
		                                        uint32_t(active_device_extensions.size()));
		vkGetPhysicalDeviceFeatures2KHR(gpu, &gpu_features2);

		pipeline_stats = stats_feature.pipelineExecutableInfo;
		if (pipeline_stats && opts.want_pipeline_stats)
			stats_feature.pipelineExecutableInfo = VK_TRUE;
		else
			stats_feature.pipelineExecutableInfo = VK_FALSE;
	}
	else
		vkGetPhysicalDeviceFeatures(gpu, &gpu_features2.features);

	VkPhysicalDeviceProperties2 gpu_props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
	if (has_device_features2)
	{
		gpu_props2.pNext = build_pnext_chain(props, api_version,
		                                     active_device_extensions.data(),
		                                     uint32_t(active_device_extensions.size()));
		vkGetPhysicalDeviceProperties2KHR(gpu, &gpu_props2);
	}
	else
		vkGetPhysicalDeviceProperties(gpu, &gpu_props2.properties);

	// A fairly ugly, but important workaround.
	// When replaying dxvk/vkd3d, we expect robustness2, but this was not captured on earlier databases,
	// which means we get different shader hashes when replaying.
	// For now, it's pragmatic to just enable robustness2 until old Fossils have been retired.
	// New fossils will capture robustness2.
	const auto *requested_pdf2 = opts.features;
	VkPhysicalDeviceFeatures2 replacement_pdf2;
	VkPhysicalDeviceRobustness2FeaturesEXT replacement_robustness2;
	VkPhysicalDeviceFragmentShadingRateFeaturesKHR replacement_fragment_shading_rate;

	const auto begin_replacement = [&](void *pnext) {
		if (&replacement_pdf2 != requested_pdf2)
		{
			replacement_pdf2 = *requested_pdf2;
			requested_pdf2 = &replacement_pdf2;
		}

		static_cast<VkBaseOutStructure *>(pnext)->pNext =
				static_cast<VkBaseOutStructure *>(replacement_pdf2.pNext);
		replacement_pdf2.pNext = pnext;
	};

	if (opts.features)
	{
		if (application_info_promote_robustness2(opts.application_info) &&
		    find_pnext<VkPhysicalDeviceRobustness2FeaturesEXT>(
				    VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT,
				    opts.features->pNext) == nullptr)
		{
			replacement_robustness2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
			begin_replacement(&replacement_robustness2);

			replacement_robustness2.robustBufferAccess2 = opts.features->features.robustBufferAccess;
			replacement_robustness2.robustImageAccess2 = opts.features->features.robustBufferAccess;
			replacement_robustness2.nullDescriptor = VK_TRUE;
		}

		if (application_info_promote_fragment_shading_rate(opts.application_info) &&
		    find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				    VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR,
				    opts.features->pNext) == nullptr)
		{
			replacement_fragment_shading_rate = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
			begin_replacement(&replacement_fragment_shading_rate);
			reset_features(replacement_fragment_shading_rate, VK_TRUE);
		}
	}

	size_t active_extension_count = active_device_extensions.size();
	filter_feature_enablement(gpu_features2, features, requested_pdf2,
	                          active_device_extensions.data(), &active_extension_count);
	active_device_extensions.resize(active_extension_count);

	// Just pick one graphics queue.
	// FIXME: Does shader compilation depend on which queues we have enabled?
	// FIXME: Potentially separate code-gen if COMPUTE queue needs different optimizations, etc ...
	uint32_t family_count = 0;
	vkGetPhysicalDeviceQueueFamilyProperties(gpu, &family_count, nullptr);
	vector<VkQueueFamilyProperties> queue_props(family_count);
	vkGetPhysicalDeviceQueueFamilyProperties(gpu, &family_count, queue_props.data());

	VkDeviceQueueCreateInfo queue_info = { VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO };
	static float one = 1.0f;
	queue_info.pQueuePriorities = &one;
	queue_info.queueCount = 1;
	for (auto &queue_prop : queue_props)
	{
		if ((queue_prop.queueCount > 0) && (queue_prop.queueFlags & VK_QUEUE_GRAPHICS_BIT))
		{
			queue_info.queueFamilyIndex = uint32_t(&queue_prop - queue_props.data());
			break;
		}
	}

	vector<const char *> active_device_layers;
	if (opts.enable_validation)
	{
		uint32_t device_layer_count = 0;
		if (vkEnumerateDeviceLayerProperties(gpu, &device_layer_count, nullptr) != VK_SUCCESS)
			return false;
		vector<VkLayerProperties> device_layers(device_layer_count);
		if (device_layer_count && vkEnumerateDeviceLayerProperties(gpu, &device_layer_count, device_layers.data()) != VK_SUCCESS)
			return false;

		if (find_layer(device_layers, "VK_LAYER_KHRONOS_validation"))
		{
			active_device_layers.push_back("VK_LAYER_KHRONOS_validation");

			uint32_t validation_ext_count = 0;
			vkEnumerateDeviceExtensionProperties(gpu, "VK_LAYER_KHRONOS_validation", &validation_ext_count, nullptr);
			vector<VkExtensionProperties> validation_extensions(validation_ext_count);
			vkEnumerateDeviceExtensionProperties(gpu, "VK_LAYER_KHRONOS_validation", &validation_ext_count, validation_extensions.data());
			validation_cache = find_extension(validation_extensions, VK_EXT_VALIDATION_CACHE_EXTENSION_NAME);
			if (validation_cache)
				active_device_extensions.push_back(VK_EXT_VALIDATION_CACHE_EXTENSION_NAME);
		}
		else
		{
			LOGE("Cannot find VK_LAYER_KHRONOS_validation layer.\n");
			return false;
		}
	}

	supports_pipeline_feedback = find_if(begin(active_device_extensions), end(active_device_extensions), [](const char *ext) {
		return strcmp(ext, VK_EXT_PIPELINE_CREATION_FEEDBACK_EXTENSION_NAME) == 0;
	}) != end(active_device_extensions);

	amd_shader_info = find_if(begin(active_device_extensions), end(active_device_extensions), [](const char *ext) {
		return strcmp(ext, VK_AMD_SHADER_INFO_EXTENSION_NAME) == 0;
	}) != end(active_device_extensions);

	supports_module_identifiers = features.shader_module_identifier.shaderModuleIdentifier == VK_TRUE;

	VkDeviceCreateInfo device_info = { VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO };
	device_info.pNext = has_device_features2 ? &gpu_features2 : nullptr;
	device_info.pEnabledFeatures = has_device_features2 ? nullptr : &gpu_features2.features;
	device_info.pQueueCreateInfos = &queue_info;
	device_info.queueCreateInfoCount = 1;
	device_info.enabledLayerCount = uint32_t(active_device_layers.size());
	device_info.ppEnabledLayerNames = active_device_layers.empty() ? nullptr : active_device_layers.data();
	device_info.enabledExtensionCount = uint32_t(active_device_extensions.size());
	device_info.ppEnabledExtensionNames = active_device_extensions.empty() ? nullptr : active_device_extensions.data();

	if (device_info.ppEnabledLayerNames)
		for (uint32_t i = 0; i < device_info.enabledLayerCount; i++)
			LOGI("Enabling device layer: %s\n", device_info.ppEnabledLayerNames[i]);

	if (device_info.ppEnabledExtensionNames)
		for (uint32_t i = 0; i < device_info.enabledExtensionCount; i++)
			LOGI("Enabling device extension: %s\n", device_info.ppEnabledExtensionNames[i]);

	if (vkCreateDevice(gpu, &device_info, nullptr, &device) != VK_SUCCESS)
	{
		LOGE("Failed to create device.\n");
		return false;
	}

	if (!feature_filter.init(api_version, active_device_extensions.data(), active_device_extensions.size(),
	                         &gpu_features2, &gpu_props2))
	{
		LOGE("Failed to init feature filter.\n");
		return false;
	}

	feature_filter.set_device_query_interface(this);

	return true;
}